

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

void wasm::Debug::dumpDWARF(Module *wasm)

{
  bool bVar1;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *this;
  reference str;
  ostream *poVar2;
  size_type sVar3;
  pointer pDVar4;
  raw_ostream *prVar5;
  undefined1 auStack_90 [8];
  DIDumpOptions options;
  CustomSection *section;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *__range2;
  undefined1 local_38 [8];
  BinaryenDWARFInfo info;
  Module *wasm_local;
  
  info.context._M_t.
  super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
  super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
       (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
       wasm;
  BinaryenDWARFInfo::BinaryenDWARFInfo((BinaryenDWARFInfo *)local_38,wasm);
  std::operator<<((ostream *)&std::cout,"DWARF debug info\n");
  std::operator<<((ostream *)&std::cout,"================\n\n");
  this = (vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *)
         ((long)info.context._M_t.
                super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>.
                _M_t.
                super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>
                .super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl + 0xd0);
  __end2 = std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::begin(this);
  section = (CustomSection *)
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                                     *)&section), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
          ::operator*(&__end2);
    wasm::Name::Name((Name *)&options.ShowChildren,&str->name);
    bVar1 = IString::startsWith<8>((IString *)&options.ShowChildren,(char (*) [8])".debug_");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Contains section ");
      poVar2 = std::operator<<(poVar2,(string *)str);
      poVar2 = std::operator<<(poVar2," (");
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&str->data);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
      std::operator<<(poVar2," bytes)\n");
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
    ::operator++(&__end2);
  }
  llvm::DIDumpOptions::DIDumpOptions((DIDumpOptions *)auStack_90);
  auStack_90._0_4_ = 0xffffffff;
  options.ParentRecurseDepth = CONCAT31(options.ParentRecurseDepth._1_3_,1);
  options.Version._0_1_ = 1;
  pDVar4 = std::unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>::operator->
                     ((unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> *)
                      &info.sections.field_0x18);
  prVar5 = llvm::outs();
  (*(pDVar4->super_DIContext)._vptr_DIContext[2])(pDVar4,prVar5);
  BinaryenDWARFInfo::~BinaryenDWARFInfo((BinaryenDWARFInfo *)local_38);
  return;
}

Assistant:

void dumpDWARF(const Module& wasm) {
  BinaryenDWARFInfo info(wasm);
  std::cout << "DWARF debug info\n";
  std::cout << "================\n\n";
  for (auto& section : wasm.customSections) {
    if (Name(section.name).startsWith(".debug_")) {
      std::cout << "Contains section " << section.name << " ("
                << section.data.size() << " bytes)\n";
    }
  }
  llvm::DIDumpOptions options;
  options.DumpType = llvm::DIDT_All;
  options.ShowChildren = true;
  options.Verbose = true;
  info.context->dump(llvm::outs(), options);
}